

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall ON_ColorValue::ReportHelper(ON_ColorValue *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ON_Color c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_3c;
  ON_TextLog *local_38;
  
  local_3c.m_color = 0;
  ON_TextLog::Print(text_log,"color value\n");
  local_38 = text_log;
  ON_TextLog::PushIndent(text_log);
  uVar1 = (this->m_value).m_count;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    local_3c = (this->m_value).m_a[uVar5].field_0;
    uVar1 = ON_Color::Red((ON_Color *)&local_3c);
    uVar2 = ON_Color::Green((ON_Color *)&local_3c);
    uVar3 = ON_Color::Blue((ON_Color *)&local_3c);
    ON_TextLog::Print(local_38,"rbg(%d,%d,%d)",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  }
  ON_TextLog::PopIndent(local_38);
  return true;
}

Assistant:

bool ON_ColorValue::ReportHelper(ON_TextLog& text_log ) const
{
  ON_Color c;
  text_log.Print("color value\n");
  text_log.PushIndent();
  int i, count = m_value.Count();
  for ( i = 0; i < count; i++ )
  {
    c = m_value[i];
    text_log.Print("rbg(%d,%d,%d)",c.Red(),c.Green(),c.Blue());
  }
  text_log.PopIndent();
  return true;
}